

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall DSectorPlaneInterpolation::Restore(DSectorPlaneInterpolation *this)

{
  DSectorPlaneInterpolation *this_local;
  
  if ((this->ceiling & 1U) == 0) {
    secplane_t::setD(&this->sector->floorplane,this->bakheight);
    sector_t::SetPlaneTexZ(this->sector,0,this->baktexz,true);
  }
  else {
    secplane_t::setD(&this->sector->ceilingplane,this->bakheight);
    sector_t::SetPlaneTexZ(this->sector,1,this->baktexz,true);
  }
  P_RecalculateAttached3DFloors(this->sector);
  sector_t::CheckPortalPlane(this->sector,(uint)((this->ceiling & 1U) != 0));
  return;
}

Assistant:

void DSectorPlaneInterpolation::Restore()
{
	if (!ceiling)
	{
		sector->floorplane.setD(bakheight);
		sector->SetPlaneTexZ(sector_t::floor, baktexz, true);
	}
	else
	{
		sector->ceilingplane.setD(bakheight);
		sector->SetPlaneTexZ(sector_t::ceiling, baktexz, true);
	}
	P_RecalculateAttached3DFloors(sector);
	sector->CheckPortalPlane(ceiling? sector_t::ceiling : sector_t::floor);
}